

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O2

void QBenchmarkValgrindUtils::cleanup(EVP_PKEY_CTX *ctx)

{
  storage_type *psVar1;
  long lVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QDir local_90 [8];
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<QFileInfo> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (QString *)0x0;
  local_38.size = 0;
  local_50.d = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.d;
  local_50.ptr = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.ptr;
  local_50.size = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_38,(QString *)&local_50);
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("%1.*",5);
  QVar3.m_data = psVar1;
  QVar3.m_size = (qsizetype)&local_88;
  QString::fromLatin1(QVar3);
  QString::arg<QString,_true>
            ((QString *)&local_68,(QString *)&local_88,(QString *)&local_50,0,(QChar)0x20);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_38,(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  QDir::QDir(local_90,(QString *)&local_88);
  QDir::entryInfoList(&local_68,local_90,&local_38,0x12,0xffffffffffffffff);
  QDir::~QDir(local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  for (lVar2 = local_68.size << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    QFileInfo::fileName();
    QFile::remove((QString *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBenchmarkValgrindUtils::cleanup()
{
    QStringList nameFilters;
    QString base = QBenchmarkGlobalData::current->callgrindOutFileBase;
    Q_ASSERT(!base.isEmpty());
    nameFilters
        << base // overall summary
        << QString::fromLatin1("%1.*").arg(base); // individual dumps
    const QFileInfoList fiList = QDir().entryInfoList(nameFilters, QDir::Files | QDir::Readable);
    for (const QFileInfo &fileInfo : fiList) {
        const bool removeOk = QFile::remove(fileInfo.fileName());
        Q_ASSERT(removeOk);
        Q_UNUSED(removeOk);
    }
}